

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_cursor.cxx
# Opt level: O0

void __thiscall Fl_Window::cursor(Fl_Window *this,Fl_Cursor c)

{
  int iVar1;
  Fl_Window *local_28;
  Fl_Window *toplevel;
  Fl_Window *w;
  int ret;
  Fl_Cursor c_local;
  Fl_Window *this_local;
  
  toplevel = Fl_Widget::window((Fl_Widget *)this);
  local_28 = this;
  for (; toplevel != (Fl_Window *)0x0; toplevel = Fl_Widget::window((Fl_Widget *)toplevel)) {
    local_28 = toplevel;
  }
  if (local_28 == this) {
    w._4_4_ = c;
    if (c == FL_CURSOR_DEFAULT) {
      w._4_4_ = this->cursor_default;
    }
    if ((this->i != (Fl_X *)0x0) && (iVar1 = Fl_X::set_cursor(this->i,w._4_4_), iVar1 == 0)) {
      fallback_cursor(this,w._4_4_);
    }
  }
  else {
    cursor(local_28,c);
  }
  return;
}

Assistant:

void Fl_Window::cursor(Fl_Cursor c) {
  int ret;

  // the cursor must be set for the top level window, not for subwindows
  Fl_Window *w = window(), *toplevel = this;

  while (w) {
    toplevel = w;
    w = w->window();
  }

  if (toplevel != this) {
    toplevel->cursor(c);
    return;
  }

  if (c == FL_CURSOR_DEFAULT)
    c = cursor_default;

  if (!i)
    return;

  ret = i->set_cursor(c);
  if (ret)
    return;

  fallback_cursor(this, c);
}